

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

type __thiscall
llvm::make_unique<(anonymous_namespace)::ArchiveTool,llvm::StringRef&>(llvm *this,StringRef *args)

{
  ArchiveTool *this_00;
  StringRef *args_local;
  
  this_00 = (ArchiveTool *)operator_new(0x28);
  anon_unknown.dwarf_26382a::ArchiveTool::Tool(this_00,*args);
  std::
  unique_ptr<(anonymous_namespace)::ArchiveTool,std::default_delete<(anonymous_namespace)::ArchiveTool>>
  ::unique_ptr<std::default_delete<(anonymous_namespace)::ArchiveTool>,void>
            ((unique_ptr<(anonymous_namespace)::ArchiveTool,std::default_delete<(anonymous_namespace)::ArchiveTool>>
              *)this,this_00);
  return (__uniq_ptr_data<(anonymous_namespace)::ArchiveTool,_std::default_delete<(anonymous_namespace)::ArchiveTool>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::ArchiveTool,_std::default_delete<(anonymous_namespace)::ArchiveTool>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}